

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall
ON_3dmUnitsAndTolerances::Write(ON_3dmUnitsAndTolerances *this,ON_BinaryArchive *file)

{
  LengthUnitSystem LVar1;
  double x;
  ON_wString *local_48;
  bool local_21;
  ON__UINT32 local_20;
  bool rc;
  uint i;
  int version;
  ON_BinaryArchive *file_local;
  ON_3dmUnitsAndTolerances *this_local;
  
  local_21 = ON_BinaryArchive::WriteInt(file,0x66);
  LVar1 = ON_UnitSystem::UnitSystem(&this->m_unit_system);
  if (local_21) {
    local_21 = ON_BinaryArchive::WriteInt(file,(uint)LVar1);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::WriteDouble(file,this->m_absolute_tolerance);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::WriteDouble(file,this->m_angle_tolerance);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::WriteDouble(file,this->m_relative_tolerance);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::WriteInt(file,(uint)this->m_distance_display_mode);
  }
  local_20 = this->m_distance_display_precision;
  if (0x14 < local_20) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_settings.cpp"
               ,0x28e,"",
               "ON_3dmUnitsAndTolerances::Write() - m_distance_display_precision out of range.");
    local_20 = 3;
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::WriteInt(file,local_20);
  }
  if (local_21 != false) {
    x = ON_UnitSystem::MetersPerUnit(&this->m_unit_system,ON_DBL_QNAN);
    local_21 = ON_BinaryArchive::WriteDouble(file,x);
  }
  if (local_21 != false) {
    LVar1 = ON_UnitSystem::UnitSystem(&this->m_unit_system);
    if (LVar1 == CustomUnits) {
      local_48 = ON_UnitSystem::UnitSystemName(&this->m_unit_system);
    }
    else {
      local_48 = &ON_wString::EmptyString;
    }
    local_21 = ON_BinaryArchive::WriteString(file,local_48);
  }
  return local_21;
}

Assistant:

bool ON_3dmUnitsAndTolerances::Write( ON_BinaryArchive& file ) const
{
  const int version = 102;
  unsigned int i;

  // version 100 ON_3dmUnitsAndTolerances settings
  bool rc = file.WriteInt( version );
  i = static_cast<unsigned int>(m_unit_system.UnitSystem());
  if ( rc ) rc = file.WriteInt( i );
  if ( rc ) rc = file.WriteDouble( m_absolute_tolerance );
  if ( rc ) rc = file.WriteDouble( m_angle_tolerance );
  if ( rc ) rc = file.WriteDouble( m_relative_tolerance );

  // added in version 101
  i = static_cast<unsigned int>(m_distance_display_mode);
  if ( rc ) rc = file.WriteInt( i );
  i = m_distance_display_precision;
  if ( i > 20 ) 
  {
    ON_ERROR("ON_3dmUnitsAndTolerances::Write() - m_distance_display_precision out of range.");
    i = 3;
  }
  if ( rc ) rc = file.WriteInt( i );

  // added in version 102
  if ( rc ) rc = file.WriteDouble( m_unit_system.MetersPerUnit(ON_DBL_QNAN));
  if ( rc ) rc = file.WriteString( (ON::LengthUnitSystem::CustomUnits == m_unit_system.UnitSystem() ? m_unit_system.UnitSystemName() : ON_wString::EmptyString) );
  return rc;
}